

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::createList(Graph *this)

{
  int local_28;
  int local_24;
  int local_20;
  int k;
  int local_18;
  int j;
  int i;
  int nv;
  Graph *this_local;
  
  j = this->num_of_vert;
  _i = this;
  clearList(this);
  for (local_18 = 0; local_18 < j; local_18 = local_18 + 1) {
    for (k = 0; k < j; k = k + 1) {
      if (this->adj_matrix[local_18][k] == 1) {
        local_20 = k + 1;
        std::vector<int,_std::allocator<int>_>::push_back(this->adj_list + local_18,&local_20);
      }
      if (1 < this->adj_matrix[local_18][k]) {
        this->multigraph_status = true;
        this->adjoint_status = false;
        this->line_status = false;
        for (local_24 = 0; local_24 < this->adj_matrix[local_18][k]; local_24 = local_24 + 1) {
          local_28 = k + 1;
          std::vector<int,_std::allocator<int>_>::push_back(this->adj_list + local_18,&local_28);
        }
      }
    }
  }
  return;
}

Assistant:

void Graph::createList(){
   int nv = this->num_of_vert;
   this->clearList();
   for(int i = 0; i < nv; i++)
      for(int j = 0; j < nv; j++){
         if(this->adj_matrix[i][j] == 1){
            // pushes index of current column + 1 (current vertex)
            this->adj_list[i].push_back(j + 1);
         }
         // if value is bigger than 1, then G is a multigraph
         if(this->adj_matrix[i][j] > 1){
            this->multigraph_status = true;
            this->adjoint_status = false;
            this->line_status = false;
            for(int k = 0; k < this->adj_matrix[i][j]; k++){
               this->adj_list[i].push_back(j + 1);
            }
         }
      }
   return void();
}